

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlc.h
# Opt level: O3

word * Wlc_ObjTable(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int iVar1;
  
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) != (undefined1  [24])0x35
     ) {
    __assert_fail("p->Type == WLC_OBJ_TABLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                  ,0x146,"int Wlc_ObjTableId(Wlc_Obj_t *)");
  }
  iVar1 = (pObj->field_10).Fanins[1];
  if ((-1 < (long)iVar1) && (iVar1 < *(int *)((long)&p->pName + 4))) {
    return *(word **)(p->pSpec + (long)iVar1 * 8);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static inline word *       Wlc_ObjTable( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )          { return (word *)Vec_PtrEntry( p->vTables, Wlc_ObjTableId(pObj) );         }